

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

bool __thiscall flatbuffers::SwiftGRPCGenerator::generate(SwiftGRPCGenerator *this)

{
  CodeWriter *this_00;
  bool bVar1;
  Service *service;
  int iVar2;
  string final_code;
  string filename;
  FlatBufFile file;
  FlatBufFile local_f0;
  string local_d0;
  string local_b0;
  undefined **local_90;
  Parser *local_88;
  string *local_80;
  undefined4 local_78;
  string local_70;
  string local_50;
  
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"// Generated GRPC code for FlatBuffers swift!",
             (allocator<char> *)&local_90);
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  grpc_swift_generator::GenerateHeader_abi_cxx11_();
  CodeWriter::operator+=(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_88 = (this->super_BaseGenerator).parser_;
  local_80 = (this->super_BaseGenerator).file_name_;
  local_90 = &PTR__CommentHolder_002fb398;
  local_78 = 4;
  for (iVar2 = 0;
      service = (Service *)
                ((ulong)((long)(local_88->services_).vec.
                               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_88->services_).vec.
                              super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3), iVar2 < (int)service
      ; iVar2 = iVar2 + 1) {
    FlatBufFile::service(&local_f0,(int)(grpc_swift_generator *)&local_90);
    grpc_swift_generator::Generate_abi_cxx11_
              (&local_50,(grpc_swift_generator *)&local_90,
               (File *)local_f0.super_File.super_CommentHolder._vptr_CommentHolder,service);
    CodeWriter::operator+=(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_f0.super_File.super_CommentHolder._vptr_CommentHolder != (_func_int **)0x0) {
      (*(*local_f0.super_File.super_CommentHolder._vptr_CommentHolder)[1])();
    }
  }
  std::__cxx11::stringbuf::str();
  GeneratedFileName(&local_d0,(this->super_BaseGenerator).path_,
                    (this->super_BaseGenerator).file_name_);
  bVar1 = SaveFile(local_d0._M_dataplus._M_p,(string *)&local_f0,false);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  return bVar1;
}

Assistant:

bool generate() {
    code_.Clear();
    code_ += "// Generated GRPC code for FlatBuffers swift!";
    code_ += grpc_swift_generator::GenerateHeader();
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageSwift);
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      code_ += grpc_swift_generator::Generate(&file, service.get());
    }
    const auto final_code = code_.ToString();
    const auto filename = GeneratedFileName(path_, file_name_);
    return SaveFile(filename.c_str(), final_code, false);
  }